

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmBlock(ExpressionContext *ctx,VmModule *module,ExprBlock *node)

{
  VmValue *pVVar1;
  ExprBase *local_28;
  ExprBase *value;
  ExprBlock *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  for (local_28 = (node->expressions).head; local_28 != (ExprBase *)0x0; local_28 = local_28->next)
  {
    CompileVm(ctx,module,local_28);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  pVVar1 = anon_unknown.dwarf_aa461::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmBlock(ExpressionContext &ctx, VmModule *module, ExprBlock *node)
{
	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	return CheckType(ctx, node, CreateVoid(module));
}